

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O0

bool __thiscall
implementations::scheme::SchemeFrame::resolveExpression(SchemeFrame *this,cell *value)

{
  cell_type cVar1;
  bool bVar2;
  cell *pcVar3;
  reference pvVar4;
  reference pcVar5;
  allocator<implementations::scheme::cell> local_139;
  __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
  local_138;
  __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
  local_130;
  vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_> local_128;
  allocator<implementations::scheme::cell> local_109;
  __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
  local_108;
  __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
  local_100;
  __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
  local_f8;
  vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_> local_f0;
  cell local_d8;
  __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
  local_80;
  undefined4 local_78;
  vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_> local_68;
  __normal_iterator<implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
  local_50;
  __normal_iterator<implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
  local_48;
  iterator it;
  string first;
  cell *value_local;
  SchemeFrame *this_local;
  
  cVar1 = value->type;
  if (cVar1 == Symbol) {
    pcVar3 = lookup(this,&value->val);
    cell::operator=(&(this->
                     super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                     ).result,pcVar3);
    return true;
  }
  if (cVar1 == Number) {
    cell::operator=(&(this->
                     super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                     ).result,value);
    return true;
  }
  if (cVar1 != List) {
    cell::operator=(&(this->
                     super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                     ).result,value);
    return true;
  }
  bVar2 = std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
          ::empty(&value->list);
  if (bVar2) {
    cell::operator=(&(this->
                     super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                     ).result,value);
    return true;
  }
  pvVar4 = std::
           vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
           operator[](&value->list,0);
  std::__cxx11::string::string((string *)&it,(string *)&pvVar4->val);
  local_50._M_current =
       (cell *)std::
               vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
               ::begin(&value->list);
  local_48 = __gnu_cxx::
             __normal_iterator<implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
             ::operator+(&local_50,1);
  local_68.
  super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::vector
            (&local_68);
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  operator=(&this->arguments,&local_68);
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_68);
  pvVar4 = std::
           vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
           operator[](&value->list,0);
  cell::operator=(&this->exp,pvVar4);
  if ((this->exp).type == Symbol) {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it
                            ,"quote");
    if (bVar2) {
      pvVar4 = std::
               vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
               ::operator[](&value->list,1);
      cell::operator=(&(this->
                       super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                       ).result,pvVar4);
      this_local._7_1_ = true;
      goto LAB_00157e6b;
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it
                            ,"if");
    if (bVar2) {
      pcVar5 = __gnu_cxx::
               __normal_iterator<implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
               ::operator*(&local_48);
      std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
      push_back(&this->arguments,pcVar5);
      __gnu_cxx::
      __normal_iterator<implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
      ::operator++(&local_48);
      pcVar5 = __gnu_cxx::
               __normal_iterator<implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
               ::operator*(&local_48);
      std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
      push_back(&this->resolved_arguments,pcVar5);
      __gnu_cxx::
      __normal_iterator<implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
      ::operator++(&local_48);
      local_80._M_current =
           (cell *)std::
                   vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                   ::cend(&value->list);
      bVar2 = __gnu_cxx::operator!=(&local_48,&local_80);
      if (bVar2) {
        pcVar5 = __gnu_cxx::
                 __normal_iterator<implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
                 ::operator*(&local_48);
        std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
        push_back(&this->resolved_arguments,pcVar5);
      }
      else {
        std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
        push_back(&this->resolved_arguments,(value_type *)nil);
      }
      this_local._7_1_ = false;
      goto LAB_00157e6b;
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it
                            ,"set!");
    if (bVar2) {
      pcVar5 = __gnu_cxx::
               __normal_iterator<implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
               ::operator*(&local_48);
      std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
      push_back(&this->resolved_arguments,pcVar5);
      __gnu_cxx::
      __normal_iterator<implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
      ::operator++(&local_48);
      pcVar5 = __gnu_cxx::
               __normal_iterator<implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
               ::operator*(&local_48);
      std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
      push_back(&this->arguments,pcVar5);
      __gnu_cxx::
      __normal_iterator<implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
      ::operator++(&local_48);
      this_local._7_1_ = false;
      goto LAB_00157e6b;
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it
                            ,"define");
    if (bVar2) {
      pcVar5 = __gnu_cxx::
               __normal_iterator<implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
               ::operator*(&local_48);
      std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
      push_back(&this->resolved_arguments,pcVar5);
      __gnu_cxx::
      __normal_iterator<implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
      ::operator++(&local_48);
      pcVar5 = __gnu_cxx::
               __normal_iterator<implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
               ::operator*(&local_48);
      std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
      push_back(&this->arguments,pcVar5);
      __gnu_cxx::
      __normal_iterator<implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
      ::operator++(&local_48);
      this_local._7_1_ = false;
      goto LAB_00157e6b;
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it
                            ,"lambda");
    if (bVar2) {
      cell::cell(&local_d8,value);
      cell::operator=(&(this->
                       super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                       ).result,&local_d8);
      cell::~cell(&local_d8);
      (this->
      super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
      ).result.type = Lambda;
      std::shared_ptr<implementations::scheme::environment>::operator=
                (&(this->
                  super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                  ).result.env,
                 &(this->
                  super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                  ).env);
      this_local._7_1_ = true;
      goto LAB_00157e6b;
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it
                            ,"begin");
    if (bVar2) {
      local_100._M_current =
           (cell *)std::
                   vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                   ::cbegin(&value->list);
      local_f8 = __gnu_cxx::
                 __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
                 ::operator+(&local_100,1);
      local_108._M_current =
           (cell *)std::
                   vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                   ::cend(&value->list);
      std::allocator<implementations::scheme::cell>::allocator(&local_109);
      std::vector<implementations::scheme::cell,std::allocator<implementations::scheme::cell>>::
      vector<__gnu_cxx::__normal_iterator<implementations::scheme::cell_const*,std::vector<implementations::scheme::cell,std::allocator<implementations::scheme::cell>>>,void>
                ((vector<implementations::scheme::cell,std::allocator<implementations::scheme::cell>>
                  *)&local_f0,local_f8,local_108,&local_109);
      std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
      operator=(&this->resolved_arguments,&local_f0);
      std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
      ~vector(&local_f0);
      std::allocator<implementations::scheme::cell>::~allocator(&local_109);
      this_local._7_1_ = false;
      goto LAB_00157e6b;
    }
  }
  local_130._M_current =
       (cell *)std::
               vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
               ::cbegin(&value->list);
  local_138._M_current =
       (cell *)std::
               vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
               ::cend(&value->list);
  std::allocator<implementations::scheme::cell>::allocator(&local_139);
  std::vector<implementations::scheme::cell,std::allocator<implementations::scheme::cell>>::
  vector<__gnu_cxx::__normal_iterator<implementations::scheme::cell_const*,std::vector<implementations::scheme::cell,std::allocator<implementations::scheme::cell>>>,void>
            ((vector<implementations::scheme::cell,std::allocator<implementations::scheme::cell>> *)
             &local_128,local_130,local_138,&local_139);
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  operator=(&this->arguments,&local_128);
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_128);
  std::allocator<implementations::scheme::cell>::~allocator(&local_139);
  this_local._7_1_ = false;
LAB_00157e6b:
  local_78 = 1;
  std::__cxx11::string::~string((string *)&it);
  return this_local._7_1_;
}

Assistant:

bool resolveExpression(cell &value) {
		switch (value.type) {
		case Symbol:
			result = lookup(value.val);
			return true;
		case Number:
			result = value;
			return true;
		case List:
		{
			if (value.list.empty()) {
				result = value;
				return true;
			}
			auto first = value.list[0].val;
			// iterator skips first item
			cells::iterator it = value.list.begin() + 1;
			arguments = cells();
			exp = value.list[0];
			if (exp.type == Symbol) {
				if (first == "quote") {         // (quote exp)
					result = value.list[1];
					return true;
				} else if (first == "if") {     // (if test conseq [alt])
					// becomes (if conseq alt test)
					// test
					arguments.push_back(*it); ++it;
					// conseq
					resolved_arguments.push_back(*it); ++it;
					// [alt]
					if (it != value.list.cend())
						resolved_arguments.push_back(*it);
					else
						resolved_arguments.push_back(nil);
					return false;
				} else if (first == "set!") {   // (set! var exp)
					// var
					resolved_arguments.push_back(*it); ++it;
					arguments.push_back(*it); ++it;
					return false;
				} else if (first == "define") { // (define var exp)
					// var
					resolved_arguments.push_back(*it); ++it;
					// exp
					arguments.push_back(*it); ++it;
					return false;
				} else if (first == "lambda") { // (lambda (var*) exp)
					result = cell(value);
					result.type = Lambda;
					result.env = env;
					return true;
				} else if (first == "begin") {  // (begin exp*)
					resolved_arguments = cells(value.list.cbegin() + 1, value.list.cend());
					return false;
				}
			}
			// (proc exp*)
			arguments = cells(value.list.cbegin(), value.list.cend());
			return false;
		}
		default:
			// Other sort of value
			result = value;
			return true;
		}
	}